

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O2

ON_Brep * __thiscall ON_BrepRegion::RegionBoundaryBrep(ON_BrepRegion *this,ON_Brep *brep)

{
  ON_BrepFaceSide **ppOVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  ON_Brep *pOVar5;
  ulong uVar6;
  size_t c;
  ulong uVar7;
  int iVar8;
  bool bHasBoundary;
  bool bIsOriented;
  ON_SimpleArray<const_ON_BrepFaceSide_*> FS;
  ON_SimpleArray<int> subfi;
  ON_Workspace ws;
  
  ON_Workspace::ON_Workspace(&ws);
  if ((((this->m_rtop == (ON_BrepRegionTopology *)0x0) ||
       (pOVar5 = this->m_rtop->m_brep, pOVar5 == (ON_Brep *)0x0 || pOVar5 == brep)) ||
      ((pOVar5->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count < 1)
      ) || (c = (size_t)(this->m_fsi).m_count, (long)c < 1)) {
    pOVar5 = (ON_Brep *)0x0;
    goto LAB_00434ddf;
  }
  ON_SimpleArray<const_ON_BrepFaceSide_*>::ON_SimpleArray(&FS,c);
  ON_SimpleArray<int>::ON_SimpleArray(&subfi,(long)(this->m_fsi).m_count);
  for (iVar8 = 0; iVar8 < (this->m_fsi).m_count; iVar8 = iVar8 + 1) {
    _bIsOriented = FaceSide(this,iVar8);
    if (((_bIsOriented == (ON_BrepFaceSide *)0x0) || (iVar2 = _bIsOriented->m_fi, iVar2 < 0)) ||
       ((pOVar5->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count <=
        iVar2)) goto LAB_00434e58;
    uVar6 = (ulong)(uint)FS.m_count;
    if (FS.m_count < 1) {
      uVar6 = 0;
    }
    uVar7 = 0;
    do {
      if (uVar6 == uVar7) {
        ON_SimpleArray<const_ON_BrepFaceSide_*>::Append(&FS,(ON_BrepFaceSide **)&bIsOriented);
        ON_SimpleArray<int>::Append(&subfi,&_bIsOriented->m_fi);
        break;
      }
      ppOVar1 = FS.m_a + uVar7;
      uVar7 = uVar7 + 1;
    } while (iVar2 != (*ppOVar1)->m_fi);
  }
  pOVar5 = ON_Brep::SubBrep(pOVar5,subfi.m_count,subfi.m_a,brep);
  if (pOVar5 == (ON_Brep *)0x0) {
LAB_00434e58:
    pOVar5 = (ON_Brep *)0x0;
  }
  else {
    uVar3 = (pOVar5->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count
    ;
    uVar6 = 0;
    if (uVar3 != FS.m_count) goto LAB_00434e58;
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 * 0x1b - uVar6 != 0; uVar6 = uVar6 + 0x1b) {
      (((pOVar5->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a)->
      m_face_uuid).Data4[uVar6 * 8 + -0x10] = (byte)((uint)(*FS.m_a)->m_srf_dir >> 0x1f);
      FS.m_a = FS.m_a + 1;
    }
    _bIsOriented = (ON_BrepFaceSide *)((ulong)_bIsOriented & 0xffffffffffffff00);
    bHasBoundary = true;
    bVar4 = ON_Brep::IsManifold(pOVar5,&bIsOriented,&bHasBoundary);
    if (((bVar4) && (bIsOriented == true)) && (bHasBoundary == false)) {
      if (this->m_type == 0) {
        iVar8 = 1;
      }
      else {
        if (this->m_type != 1) goto LAB_00434e5b;
        iVar8 = 2;
      }
      pOVar5->m_is_solid = iVar8;
    }
  }
LAB_00434e5b:
  ON_SimpleArray<int>::~ON_SimpleArray(&subfi);
  ON_SimpleArray<const_ON_BrepFaceSide_*>::~ON_SimpleArray(&FS);
LAB_00434ddf:
  ON_Workspace::~ON_Workspace(&ws);
  return pOVar5;
}

Assistant:

ON_Brep* ON_BrepRegion::RegionBoundaryBrep( ON_Brep* brep ) const
{
  ON_Workspace ws;
  if ( 0 == m_rtop )
    return 0;

  const ON_Brep* rtop_brep = m_rtop->Brep();

  if ( rtop_brep == brep || 0 == rtop_brep || rtop_brep->m_F.Count() <= 0 || m_fsi.Count() <= 0 )
    return 0;

  ON_SimpleArray<const ON_BrepFaceSide*> FS(m_fsi.Count());
  ON_SimpleArray<int> subfi(m_fsi.Count());

  int rfsi, i;
  for ( rfsi = 0; rfsi < m_fsi.Count(); rfsi++ )
  {
    const ON_BrepFaceSide* fs = FaceSide(rfsi);
    if ( 0 == fs || fs->m_fi < 0 || fs->m_fi >= rtop_brep->m_F.Count() )
      return 0;
    for ( i = 0; i < FS.Count(); i++ )
    {
      if ( fs->m_fi == FS[i]->m_fi )
        break;
    }
    if ( i < FS.Count() )
      continue;
    FS.Append(fs);
    subfi.Append(fs->m_fi);
  }

  brep = rtop_brep->SubBrep(subfi.Count(),subfi.Array(),brep);
  if ( !brep )
    return 0;
  if ( brep->m_F.Count() != FS.Count() )
    return 0;
  for ( i = 0; i < FS.Count(); i++ )
  {
    ON_BrepFace& face = brep->m_F[i];
    face.m_bRev = ( FS[i]->m_srf_dir < 0 );
  }

  bool bIsOriented = false;
  bool bHasBoundary = true;
  if ( brep->IsManifold(&bIsOriented,&bHasBoundary) )
  {
    if ( bIsOriented && !bHasBoundary )
    {
      if ( 1 == m_type )
        brep->m_is_solid = 2;
      else if ( 0 == m_type )
        brep->m_is_solid = 1;
    }
  }

  return brep;
}